

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall num_parse_test_serial_signed_Test::TestBody(num_parse_test_serial_signed_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_d0;
  Message local_c8;
  array<unsigned_char,_4UL> local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  string local_a0;
  _Type local_7c;
  AssertHelper local_78;
  Message local_70;
  array<unsigned_char,_4UL> local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  allocator<char> local_39;
  string local_38;
  array<unsigned_char,_4UL> local_14;
  num_parse_test_serial_signed_Test *pnStack_10;
  array<unsigned_char,_4UL> bytes;
  num_parse_test_serial_signed_Test *this_local;
  
  pnStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"4",&local_39);
  local_14 = mvm::num::serial<int,4ul,mvm::num::little_endian_tag>(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_64._M_elems[0] = '\x04';
  local_64._M_elems[1] = '\0';
  local_64._M_elems[2] = '\0';
  local_64._M_elems[3] = '\0';
  testing::internal::EqHelper<false>::
  Compare<std::array<unsigned_char,4ul>,std::array<unsigned_char,4ul>>
            ((EqHelper<false> *)local_60,"bytes","decltype(bytes)({0x04, 0x0, 0x0, 0x0})",&local_14,
             &local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"-4",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_7c = (_Type)mvm::num::serial<int,4ul,mvm::num::little_endian_tag>(&local_a0);
  local_14 = (array<unsigned_char,_4UL>)local_7c;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  local_bc._M_elems[0] = 0xfc;
  local_bc._M_elems[1] = 0xff;
  local_bc._M_elems[2] = 0xff;
  local_bc._M_elems[3] = 0xff;
  testing::internal::EqHelper<false>::
  Compare<std::array<unsigned_char,4ul>,std::array<unsigned_char,4ul>>
            ((EqHelper<false> *)local_b8,"bytes","decltype(bytes)({0xfc, 0xff, 0xff, 0xff})",
             &local_14,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  return;
}

Assistant:

TEST(num_parse_test, serial_signed) {
  auto bytes = serial<int32_t, 4, little_endian_tag>("4");
  EXPECT_EQ(bytes, decltype(bytes)({0x04, 0x0, 0x0, 0x0}));

  bytes = serial<int32_t, 4, little_endian_tag>("-4");
  EXPECT_EQ(bytes, decltype(bytes)({0xfc, 0xff, 0xff, 0xff}));
}